

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *pppaVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  pointer pTVar4;
  long lVar5;
  iterator __position;
  undefined1 auVar6 [16];
  double dVar7;
  bool bVar8;
  float fVar9;
  Accessor **ppAVar10;
  _Alloc_hider __src;
  iterator iVar11;
  aiNodeAnim **__src_00;
  undefined8 uVar12;
  iterator iVar13;
  undefined8 __n;
  int iVar14;
  size_t sVar15;
  Node *pNVar16;
  long lVar17;
  Logger *pLVar18;
  Accessor *pAVar19;
  Data *pDVar20;
  ulong uVar21;
  aiNodeAnim *paVar22;
  aiVectorKey *paVar23;
  aiQuatKey *paVar24;
  aiMeshMorphAnim *paVar25;
  ulong *puVar26;
  uint *puVar27;
  double *pdVar28;
  aiAnimation *paVar29;
  aiNodeAnim **__dest;
  aiMeshMorphAnim **__dest_00;
  runtime_error *this_00;
  uint uVar30;
  aiQuatKey *paVar31;
  undefined1 auVar32 [8];
  size_type *psVar33;
  size_t sVar34;
  pointer pCVar35;
  uint uVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  undefined1 auVar38 [8];
  pointer pCVar39;
  ulong uVar40;
  char cVar41;
  uint uVar42;
  ColladaLoader *pCVar43;
  _Base_ptr p_Var44;
  pointer pCVar45;
  _Base_ptr p_Var46;
  ulong uVar47;
  long lVar48;
  string *psVar49;
  size_t a;
  float fVar50;
  ai_real aVar51;
  ai_real aVar52;
  float fVar53;
  float fVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  aiMeshMorphAnim *morphAnim;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  string subElement;
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  string targetID;
  string nodeName;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  aiMatrix4x4 mat;
  aiMeshMorphAnim *local_390;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> local_388;
  undefined1 local_368 [8];
  pointer pMStack_360;
  pointer local_358 [3];
  float local_33c;
  char *local_338;
  long local_330;
  char local_328 [16];
  _Alloc_hider local_318;
  iterator iStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  ColladaParser *local_2f8;
  ai_real local_2ec;
  aiNodeAnim **local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e0;
  undefined1 local_2c8 [8];
  iterator iStack_2c0;
  aiMatrix4x4t<float> *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Base_ptr local_280;
  _Alloc_hider _Stack_278;
  Accessor *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  Data *pDStack_258;
  _Alloc_hider local_250;
  pointer local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  ColladaLoader *local_230;
  DataLibrary *local_228;
  _Base_ptr local_220;
  undefined1 local_218 [32];
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> local_1f8;
  string *local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8 [8];
  aiAnimation *paStack_1c0;
  pointer local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr p_Stack_1a0;
  pointer local_198;
  undefined8 uStack_190;
  ios_base local_158 [272];
  ai_real local_48;
  
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308._8_8_ = pSrcAnim;
  local_1d8 = pName;
  CollectNodes(this,pScene->mRootNode,&local_1f8);
  local_2e8 = (aiNodeAnim **)0x0;
  aStack_2e0._M_allocated_capacity = 0;
  aStack_2e0._8_8_ = (aiNodeAnim **)0x0;
  local_308._M_allocated_capacity = 0;
  local_318._M_p = (pointer)0x0;
  iStack_310._M_current = (aiMeshMorphAnim **)0x0;
  local_230 = this;
  if (local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_003ff982:
    bVar8 = true;
    if ((aiMeshMorphAnim **)local_318._M_p == iStack_310._M_current) goto LAB_003ffc22;
  }
  else {
    local_220 = (_Base_ptr)&pParser->mAccessorLibrary;
    local_228 = &pParser->mDataLibrary;
    p_Var46 = (_Base_ptr)
              local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2f8 = pParser;
    do {
      local_388.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar29 = *(aiAnimation **)p_Var46;
      puVar27 = (uint *)(paVar29->mName).data;
      local_218._0_8_ = local_218 + 0x10;
      local_1d0 = p_Var46;
      sVar15 = strlen((char *)puVar27);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_218,puVar27,(long)(paVar29->mName).data + sVar15);
      pNVar16 = FindNode(local_230,pParser->mRootNode,(string *)local_218);
      if (pNVar16 != (Node *)0x0) {
        local_250._M_p = (pointer)&local_240;
        local_248 = (pointer)0x0;
        local_240._M_local_buf[0] = '\0';
        local_338 = local_328;
        local_330 = 0;
        local_328[0] = '\0';
        for (paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(((vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                             *)(local_308._8_8_ + 0x20))->
                          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                          )._M_impl.super__Vector_impl_data._M_start;
            paVar37 !=
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_308._8_8_ + 0x28); paVar37 = paVar37 + 0xc) {
          local_2c8 = (undefined1  [8])0x0;
          iStack_2c0._M_current = (aiMatrix4x4t<float> *)&local_2b0;
          local_2b8 = (aiMatrix4x4t<float> *)0x0;
          local_2b0._M_local_buf[0] = '\0';
          local_2a0._M_allocated_capacity = (size_type)&local_290;
          local_2a0._8_8_ = (char *)0x0;
          local_290._M_local_buf[0] = '\0';
          aStack_268._8_8_ = 0;
          pDStack_258 = (Data *)0x0;
          local_270 = (Accessor *)0x0;
          aStack_268._M_allocated_capacity = 0;
          local_280 = (_Base_ptr)0x0;
          _Stack_278._M_p = (pointer)0x0;
          cVar41 = (char)paVar37;
          lVar17 = std::__cxx11::string::find(cVar41,0x2f);
          if (lVar17 == -1) {
            lVar17 = std::__cxx11::string::find
                               (paVar37->_M_local_buf,(ulong)(pNVar16->mID)._M_dataplus._M_p,0);
            if (lVar17 != -1) {
              local_2c8 = (undefined1  [8])paVar37;
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
              std::__cxx11::string::operator=((string *)&iStack_2c0,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
              }
              if (*(char *)iStack_2c0._M_current == '-') {
                std::__cxx11::string::substr((ulong)local_1c8,(ulong)&iStack_2c0);
                std::__cxx11::string::operator=((string *)&iStack_2c0,(string *)local_1c8);
                if (local_1c8 != (undefined1  [8])&local_1b8) {
                  operator_delete((void *)local_1c8);
                }
              }
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back(&local_388,(value_type *)local_2c8);
            }
          }
          else {
            lVar17 = std::__cxx11::string::find(cVar41,0x2f);
            if (lVar17 == -1) {
              local_248 = (pointer)0x0;
              *local_250._M_p = '\0';
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
              std::__cxx11::string::operator=((string *)&local_250,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
              }
              if ((local_248 == (pointer)(pNVar16->mID)._M_string_length) &&
                 ((local_248 == (pointer)0x0 ||
                  (iVar14 = bcmp(local_250._M_p,(pNVar16->mID)._M_dataplus._M_p,(size_t)local_248),
                  iVar14 == 0)))) {
                lVar17 = std::__cxx11::string::find(cVar41,0x2e);
                if (lVar17 == -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                }
                else {
                  lVar17 = std::__cxx11::string::find(cVar41,0x2e);
                  if (lVar17 != -1) goto LAB_003fe85b;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  local_330 = 0;
                  *local_338 = '\0';
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
                  std::__cxx11::string::operator=((string *)&local_338,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  iVar14 = std::__cxx11::string::compare((char *)&local_338);
                  if (iVar14 == 0) {
                    _Stack_278._M_p = (pointer)0x3;
                  }
                  else {
                    iVar14 = std::__cxx11::string::compare((char *)&local_338);
                    if (iVar14 == 0) {
                      _Stack_278._M_p = (pointer)0x0;
                    }
                    else {
                      iVar14 = std::__cxx11::string::compare((char *)&local_338);
                      if (iVar14 == 0) {
                        _Stack_278._M_p = (pointer)0x1;
                      }
                      else {
                        iVar14 = std::__cxx11::string::compare((char *)&local_338);
                        if (iVar14 == 0) {
                          _Stack_278._M_p = (pointer)0x2;
                        }
                        else {
                          pLVar18 = DefaultLogger::get();
                          Formatter::
                          basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                          basic_formatter<char[26]>
                                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1c8,(char (*) [26])"Unknown anim subelement <");
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,local_338,local_330);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,">. Ignoring",0xb);
                          std::__cxx11::stringbuf::str();
                          Logger::warn(pLVar18,(char *)local_368);
                          if (local_368 != (undefined1  [8])local_358) {
                            operator_delete((void *)local_368);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                          std::ios_base::~ios_base(local_158);
                        }
                      }
                    }
                  }
                }
                lVar17 = std::__cxx11::string::find(cVar41,0x28);
                if (lVar17 != -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  local_330 = 0;
                  *local_338 = '\0';
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar37);
                  std::__cxx11::string::operator=((string *)&local_338,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  iVar14 = std::__cxx11::string::compare((char *)&local_338);
                  if (iVar14 == 0) {
                    _Stack_278._M_p = (pointer)0x0;
                  }
                  else {
                    iVar14 = std::__cxx11::string::compare((char *)&local_338);
                    if (iVar14 == 0) {
                      _Stack_278._M_p = (pointer)0x1;
                    }
                    else {
                      iVar14 = std::__cxx11::string::compare((char *)&local_338);
                      if (iVar14 == 0) {
                        _Stack_278._M_p = (pointer)0x2;
                      }
                      else {
                        iVar14 = std::__cxx11::string::compare((char *)&local_338);
                        if (iVar14 == 0) {
                          _Stack_278._M_p = (pointer)0x3;
                        }
                        else {
                          iVar14 = std::__cxx11::string::compare((char *)&local_338);
                          if (iVar14 == 0) {
                            _Stack_278._M_p = (pointer)0x4;
                          }
                          else {
                            iVar14 = std::__cxx11::string::compare((char *)&local_338);
                            if (iVar14 == 0) {
                              _Stack_278._M_p = (pointer)0x5;
                            }
                            else {
                              iVar14 = std::__cxx11::string::compare((char *)&local_338);
                              if (iVar14 == 0) {
                                _Stack_278._M_p = (pointer)0x6;
                              }
                              else {
                                iVar14 = std::__cxx11::string::compare((char *)&local_338);
                                if (iVar14 == 0) {
                                  _Stack_278._M_p = (pointer)0x7;
                                }
                                else {
                                  iVar14 = std::__cxx11::string::compare((char *)&local_338);
                                  if (iVar14 == 0) {
                                    _Stack_278._M_p = (pointer)0x8;
                                  }
                                  else {
                                    iVar14 = std::__cxx11::string::compare((char *)&local_338);
                                    if (iVar14 == 0) {
                                      _Stack_278._M_p = (pointer)0x9;
                                    }
                                    else {
                                      iVar14 = std::__cxx11::string::compare((char *)&local_338);
                                      if (iVar14 == 0) {
                                        _Stack_278._M_p = (pointer)0xa;
                                      }
                                      else {
                                        iVar14 = std::__cxx11::string::compare((char *)&local_338);
                                        if (iVar14 == 0) {
                                          _Stack_278._M_p = (pointer)0xb;
                                        }
                                        else {
                                          iVar14 = std::__cxx11::string::compare((char *)&local_338)
                                          ;
                                          if (iVar14 == 0) {
                                            _Stack_278._M_p = (pointer)0xc;
                                          }
                                          else {
                                            iVar14 = std::__cxx11::string::compare
                                                               ((char *)&local_338);
                                            if (iVar14 == 0) {
                                              _Stack_278._M_p = (pointer)0xd;
                                            }
                                            else {
                                              iVar14 = std::__cxx11::string::compare
                                                                 ((char *)&local_338);
                                              if (iVar14 == 0) {
                                                _Stack_278._M_p = (pointer)0xe;
                                              }
                                              else {
                                                iVar14 = std::__cxx11::string::compare
                                                                   ((char *)&local_338);
                                                if (iVar14 == 0) {
                                                  _Stack_278._M_p = (pointer)0xf;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                __n = local_2a0._8_8_;
                uVar12 = local_2a0._M_allocated_capacity;
                local_280 = (_Base_ptr)0xffffffffffffffff;
                pTVar4 = (pNVar16->mTransforms).
                         super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar17 = (long)(pNVar16->mTransforms).
                               super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4;
                if (lVar17 == 0) {
LAB_003fec4c:
                  lVar17 = std::__cxx11::string::find(local_2a0._M_local_buf,0x6b5c9d,0);
                  if (lVar17 == -1) goto LAB_003fe85b;
                  std::__cxx11::string::_M_assign((string *)&iStack_2c0);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_2a0,0,(char *)local_2a0._8_8_,0x6acbf4);
                }
                else {
                  psVar33 = &(pTVar4->mID)._M_string_length;
                  p_Var46 = (_Base_ptr)0xffffffffffffffff;
                  p_Var44 = (_Base_ptr)0x0;
                  do {
                    if (((char *)*psVar33 == (char *)__n) &&
                       (((char *)__n == (char *)0x0 ||
                        (iVar14 = bcmp((((string *)(psVar33 + -1))->_M_dataplus)._M_p,(void *)uVar12
                                       ,__n), iVar14 == 0)))) {
                      p_Var46 = p_Var44;
                      local_280 = p_Var44;
                    }
                    p_Var44 = (_Base_ptr)((long)&p_Var44->_M_color + 1);
                    psVar33 = psVar33 + 0xd;
                  } while (p_Var44 < (_Base_ptr)((lVar17 >> 3) * 0x4ec4ec4ec4ec4ec5));
                  if (p_Var46 == (_Base_ptr)0xffffffffffffffff) goto LAB_003fec4c;
                }
                local_2c8 = (undefined1  [8])paVar37;
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back(&local_388,(value_type *)local_2c8);
              }
            }
          }
LAB_003fe85b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_allocated_capacity != &local_290) {
            operator_delete((void *)local_2a0._M_allocated_capacity);
          }
          pParser = local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)iStack_2c0._M_current != &local_2b0) {
            operator_delete(iStack_2c0._M_current);
          }
        }
        if (local_388.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_388.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          fVar9 = 1e+20;
          pCVar35 = local_388.
                    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pAVar19 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                          *)local_220,&pCVar35->mChannel->mSourceTimes);
            pCVar35->mTimeAccessor = pAVar19;
            pDVar20 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                (pParser,local_228,&pAVar19->mSource);
            pCVar35->mTimeData = pDVar20;
            pAVar19 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                          *)local_220,&pCVar35->mChannel->mSourceValues);
            pCVar35->mValueAccessor = pAVar19;
            pDVar20 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                (pParser,local_228,&pAVar19->mSource);
            pCVar35->mValueData = pDVar20;
            pAVar19 = pCVar35->mTimeAccessor;
            sVar34 = pAVar19->mCount;
            if (sVar34 != pCVar35->mValueAccessor->mCount) {
LAB_003ffc70:
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,
                         "Time count / value count mismatch in animation channel \"",0x38);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(pCVar35->mChannel->mTarget)._M_dataplus._M_p,
                         (pCVar35->mChannel->mTarget)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\".",2);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(this_00,(string *)local_2c8);
              *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (sVar34 != 0) {
              pDVar20 = pCVar35->mTimeData;
              pCVar43 = (ColladaLoader *)
                        (pDVar20->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              if ((ulong)((long)(pDVar20->mValues).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar43 >> 2) <=
                  pAVar19->mOffset) {
                __assert_fail("pos < pData.mValues.size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaLoader.cpp"
                              ,0x74a,
                              "ai_real Assimp::ColladaLoader::ReadFloat(const Collada::Accessor &, const Collada::Data &, size_t, size_t) const"
                             );
              }
              fVar50 = *(float *)((long)&(pCVar43->super_BaseImporter)._vptr_BaseImporter +
                                 pAVar19->mOffset * 4);
              if (fVar9 <= fVar50) {
                fVar50 = fVar9;
              }
              ReadFloat(pCVar43,pAVar19,pDVar20,sVar34 - 1,0);
              fVar9 = fVar50;
            }
            pCVar35 = pCVar35 + 1;
          } while (pCVar35 !=
                   local_388.
                   super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          local_2c8 = (undefined1  [8])0x0;
          iStack_2c0._M_current = (aiMatrix4x4t<float> *)0x0;
          local_2b8 = (aiMatrix4x4t<float> *)0x0;
          if ((pCVar35 ==
               local_388.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start) ||
             ((local_388.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount == 0)) {
LAB_003ff481:
            pLVar18 = DefaultLogger::get();
            Logger::warn(pLVar18,
                         "Collada loader: found empty animation channel, ignored. Please check your exporter."
                        );
          }
          else {
            pCVar43 = (ColladaLoader *)local_368;
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    *)local_368,&pNVar16->mTransforms);
            pCVar35 = local_388.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            do {
              pCVar45 = local_388.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_388.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start != pCVar35) {
                do {
                  pAVar19 = pCVar45->mTimeAccessor;
                  if (pAVar19->mCount == 0) {
                    fVar50 = 0.0;
                    uVar21 = 0xffffffffffffffff;
                    uVar47 = 0;
                  }
                  else {
                    uVar47 = 0;
                    do {
                      fVar50 = ReadFloat(pCVar43,pAVar19,pCVar45->mTimeData,uVar47,0);
                      pAVar19 = pCVar45->mTimeAccessor;
                      if (fVar9 <= fVar50) break;
                      uVar47 = uVar47 + 1;
                    } while (uVar47 < pAVar19->mCount);
                    uVar21 = pAVar19->mCount - 1;
                  }
                  if (uVar21 < uVar47) {
                    uVar47 = uVar21;
                  }
                  pAVar19 = pCVar45->mValueAccessor;
                  if (pAVar19->mSize == 0) {
                    uVar21 = 0;
                  }
                  else {
                    sVar34 = 0;
                    do {
                      aVar51 = ReadFloat(pCVar43,pAVar19,pCVar45->mValueData,uVar47,sVar34);
                      *(ai_real *)(local_1c8 + sVar34 * 4) = aVar51;
                      sVar34 = sVar34 + 1;
                      pAVar19 = pCVar45->mValueAccessor;
                      uVar21 = pAVar19->mSize;
                    } while (sVar34 < uVar21);
                  }
                  if ((fVar50 <= fVar9) || (uVar47 == 0)) {
LAB_003fef50:
                    if (uVar21 != 0) {
                      pCVar43 = (ColladaLoader *)
                                (((aiString *)local_368)->data +
                                pCVar45->mSubElement * 4 + pCVar45->mTransformIndex * 0x68 + 0x20);
                      memcpy(pCVar43,local_1c8,uVar21 << 2);
                    }
                  }
                  else {
                    aVar51 = ReadFloat(pCVar43,pCVar45->mTimeAccessor,pCVar45->mTimeData,uVar47 - 1,
                                       0);
                    pAVar19 = pCVar45->mValueAccessor;
                    if (pAVar19->mSize != 0) {
                      sVar34 = 0;
                      do {
                        aVar52 = ReadFloat(pCVar43,pAVar19,pCVar45->mValueData,uVar47 - 1,sVar34);
                        *(float *)(local_1c8 + sVar34 * 4) =
                             (aVar52 - *(float *)(local_1c8 + sVar34 * 4)) *
                             ((fVar9 - fVar50) / (aVar51 - fVar50)) +
                             *(float *)(local_1c8 + sVar34 * 4);
                        sVar34 = sVar34 + 1;
                        pAVar19 = pCVar45->mValueAccessor;
                        uVar21 = pAVar19->mSize;
                      } while (sVar34 < uVar21);
                      goto LAB_003fef50;
                    }
                  }
                  pCVar45 = pCVar45 + 1;
                } while (pCVar45 !=
                         local_388.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              pParser = local_2f8;
              pCVar43 = (ColladaLoader *)local_1c8;
              ColladaParser::CalculateResultTransform
                        ((aiMatrix4x4 *)local_1c8,local_2f8,
                         (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          *)local_368);
              uStack_190 = (pointer)CONCAT44(fVar9,(float)uStack_190);
              if (iStack_2c0._M_current == local_2b8) {
                pCVar43 = (ColladaLoader *)local_2c8;
                std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
                _M_realloc_insert<aiMatrix4x4t<float>const&>
                          ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                           pCVar43,iStack_2c0,(aiMatrix4x4t<float> *)local_1c8);
              }
              else {
                *(pointer *)&(iStack_2c0._M_current)->d1 = local_198;
                *(pointer *)&(iStack_2c0._M_current)->d3 = uStack_190;
                *(_Base_ptr *)&(iStack_2c0._M_current)->c1 = local_1a8;
                *(_Base_ptr *)&(iStack_2c0._M_current)->c3 = p_Stack_1a0;
                *(pointer *)&(iStack_2c0._M_current)->b1 = local_1b8;
                *(_Base_ptr *)&(iStack_2c0._M_current)->b3 = p_Stack_1b0;
                (iStack_2c0._M_current)->a1 = (float)local_1c8._0_4_;
                (iStack_2c0._M_current)->a2 = (float)local_1c8._4_4_;
                *(aiAnimation **)&(iStack_2c0._M_current)->a3 = paStack_1c0;
                iStack_2c0._M_current = iStack_2c0._M_current + 1;
              }
              pCVar35 = local_388.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_388.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_388.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                fVar50 = 1e+20;
              }
              else {
                fVar50 = 1e+20;
                do {
                  pAVar19 = pCVar35->mTimeAccessor;
                  if (pAVar19->mCount == 0) {
                    uVar47 = 0;
                    fVar53 = fVar50;
                  }
                  else {
                    uVar47 = 0;
                    do {
                      fVar53 = ReadFloat(pCVar43,pAVar19,pCVar35->mTimeData,uVar47,0);
                      if (fVar9 < fVar53) {
                        if (fVar50 <= fVar53) {
                          fVar53 = fVar50;
                        }
                        break;
                      }
                      uVar47 = uVar47 + 1;
                      pAVar19 = pCVar35->mTimeAccessor;
                      fVar53 = fVar50;
                    } while (uVar47 < pAVar19->mCount);
                  }
                  fVar50 = fVar53;
                  if ((((*(int *)(((aiString *)local_368)->data +
                                 pCVar35->mTransformIndex * 0x68 + 0x1c) == 1) && (uVar47 != 0)) &&
                      (pCVar35->mSubElement == 3)) && (uVar47 < pCVar35->mTimeAccessor->mCount)) {
                    local_48 = ReadFloat(pCVar43,pCVar35->mValueAccessor,pCVar35->mValueData,uVar47,
                                         0);
                    local_2ec = ReadFloat(pCVar43,pCVar35->mValueAccessor,pCVar35->mValueData,
                                          uVar47 - 1,0);
                    local_33c = ReadFloat(pCVar43,pCVar35->mTimeAccessor,pCVar35->mTimeData,uVar47,0
                                         );
                    aVar51 = ReadFloat(pCVar43,pCVar35->mTimeAccessor,pCVar35->mTimeData,uVar47 - 1,
                                       0);
                    fVar54 = ABS(local_48 -
                                 (((fVar9 - aVar51) * (local_48 - local_2ec)) / (local_33c - aVar51)
                                 + local_2ec));
                    if (180.0 <= fVar54) {
                      if ((local_33c != fVar9) || (NAN(local_33c) || NAN(fVar9))) {
                        dVar7 = floor((double)fVar54 / 90.0);
                        fVar50 = (local_33c - fVar9) / (float)(int)dVar7 + fVar9;
                        if (fVar53 <= fVar50) {
                          fVar50 = fVar53;
                        }
                      }
                    }
                  }
                  pCVar35 = pCVar35 + 1;
                } while (pCVar35 !=
                         local_388.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              fVar9 = fVar50;
            } while (fVar9 <= 1e+19);
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            ~vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                     *)local_368);
            iVar13._M_current = iStack_2c0._M_current;
            auVar38 = local_2c8;
            if (local_2c8 == (undefined1  [8])iStack_2c0._M_current) goto LAB_003ff481;
            paVar22 = (aiNodeAnim *)operator_new(0x438);
            (paVar22->mNodeName).length = 0;
            (paVar22->mNodeName).data[0] = '\0';
            memset((paVar22->mNodeName).data + 1,0x1b,0x3ff);
            uVar12 = local_218._8_8_;
            paVar22->mRotationKeys = (aiQuatKey *)0x0;
            paVar22->mNumScalingKeys = 0;
            *(undefined8 *)&paVar22->mNumPositionKeys = 0;
            *(undefined8 *)((long)&paVar22->mPositionKeys + 4) = 0;
            paVar22->mScalingKeys = (aiVectorKey *)0x0;
            paVar22->mPreState = aiAnimBehaviour_DEFAULT;
            paVar22->mPostState = aiAnimBehaviour_DEFAULT;
            local_368 = (undefined1  [8])paVar22;
            if ((ulong)local_218._8_8_ < (_Base_ptr)0x400) {
              (paVar22->mNodeName).length = (ai_uint32)local_218._8_8_;
              memcpy((paVar22->mNodeName).data,(void *)local_218._0_8_,local_218._8_8_);
              (paVar22->mNodeName).data[uVar12] = '\0';
            }
            uVar21 = (long)iVar13._M_current - (long)auVar38 >> 6;
            uVar36 = (uint)uVar21;
            paVar22->mNumPositionKeys = uVar36;
            paVar22->mNumRotationKeys = uVar36;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar21;
            uVar47 = SUB168(auVar6 * ZEXT816(0x18),0);
            paVar22->mNumScalingKeys = uVar36;
            if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
              uVar47 = 0xffffffffffffffff;
            }
            paVar23 = (aiVectorKey *)operator_new__(uVar47);
            lVar17 = 0;
            do {
              puVar3 = (undefined8 *)((long)&paVar23->mTime + lVar17);
              *puVar3 = 0;
              puVar3[1] = 0;
              *(undefined4 *)((long)&(paVar23->mValue).z + lVar17) = 0;
              lVar17 = lVar17 + 0x18;
            } while (uVar21 * 0x18 != lVar17);
            paVar22->mPositionKeys = paVar23;
            paVar24 = (aiQuatKey *)operator_new__(uVar47);
            paVar31 = paVar24;
            do {
              paVar31->mTime = 0.0;
              (paVar31->mValue).w = 1.0;
              (paVar31->mValue).x = 0.0;
              (paVar31->mValue).y = 0.0;
              (paVar31->mValue).z = 0.0;
              paVar31 = paVar31 + 1;
            } while (paVar31 != paVar24 + uVar21);
            paVar22->mRotationKeys = paVar24;
            paVar23 = (aiVectorKey *)operator_new__(uVar47);
            lVar17 = 0;
            do {
              puVar3 = (undefined8 *)((long)&paVar23->mTime + lVar17);
              *puVar3 = 0;
              puVar3[1] = 0;
              *(undefined4 *)((long)&(paVar23->mValue).z + lVar17) = 0;
              lVar17 = lVar17 + 0x18;
            } while (uVar21 * 0x18 != lVar17);
            paVar22->mScalingKeys = paVar23;
            lVar17 = 8;
            lVar48 = 0;
            uVar47 = 0;
            do {
              local_1c8 = *(undefined1 (*) [8])((long)auVar38 + lVar48);
              paStack_1c0 = *(aiAnimation **)((char *)((long)auVar38 + lVar48) + 8);
              local_1b8 = *(pointer *)((long)auVar38 + lVar48 + 0x10);
              p_Stack_1b0 = *(_Base_ptr *)((char *)((long)auVar38 + lVar48 + 0x10) + 8);
              local_1a8 = *(_Base_ptr *)((long)auVar38 + lVar48 + 0x20);
              p_Stack_1a0 = *(_Base_ptr *)((char *)((long)auVar38 + lVar48 + 0x20) + 8);
              psVar2 = (size_t *)((long)auVar38 + lVar48 + 0x30);
              local_198 = (pointer)*psVar2;
              sVar34 = psVar2[1];
              uStack_190._4_4_ = (float)(sVar34 >> 0x20);
              dVar7 = (double)uStack_190._4_4_;
              uStack_190._0_4_ = (float)sVar34;
              uStack_190 = (pointer)CONCAT44(0x3f800000,(float)uStack_190);
              *(double *)((long)*(aiVectorKey **)((long)local_368 + 0x408) + lVar17 + -8) = dVar7;
              *(double *)((long)*(aiQuatKey **)((long)local_368 + 0x418) + lVar17 + -8) = dVar7;
              *(double *)((long)*(aiVectorKey **)((long)local_368 + 0x428) + lVar17 + -8) = dVar7;
              aiMatrix4x4t<float>::Decompose
                        ((aiMatrix4x4t<float> *)local_1c8,
                         (aiVector3t<float> *)
                         ((long)&(*(aiVectorKey **)((long)local_368 + 0x428))->mTime + lVar17),
                         (aiQuaterniont<float> *)
                         ((long)&(*(aiQuatKey **)((long)local_368 + 0x418))->mTime + lVar17),
                         (aiVector3t<float> *)
                         ((long)&(*(aiVectorKey **)((long)local_368 + 0x408))->mTime + lVar17));
              uVar47 = uVar47 + 1;
              lVar17 = lVar17 + 0x18;
              lVar48 = lVar48 + 0x40;
              auVar38 = local_2c8;
            } while (uVar47 < (ulong)((long)iStack_2c0._M_current - (long)local_2c8 >> 6));
            if (aStack_2e0._M_allocated_capacity == aStack_2e0._8_8_) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>
                        ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_2e8,
                         (iterator)aStack_2e0._M_allocated_capacity,(aiNodeAnim **)local_368);
              pParser = local_2f8;
            }
            else {
              *(undefined1 (*) [8])aStack_2e0._M_allocated_capacity = local_368;
              aStack_2e0._M_allocated_capacity = aStack_2e0._M_allocated_capacity + 8;
              pParser = local_2f8;
            }
          }
          if ((local_388.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_388.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_388.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            local_1c8 = (undefined1  [8])0x0;
            paStack_1c0 = (aiAnimation *)0x0;
            local_1b8 = (pointer)0x0;
            psVar49 = &(local_388.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start)->mTargetId;
            do {
              if ((psVar49->_M_string_length != 0) &&
                 (lVar17 = std::__cxx11::string::find((char *)psVar49,0x6b5c9d,0), lVar17 != -1)) {
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                             *)local_1c8,(value_type *)((long)(psVar49 + -1) + 0x18));
              }
              auVar38 = local_1c8;
              ppAVar10 = (Accessor **)(psVar49 + 3);
              psVar49 = (string *)((long)(psVar49 + 3) + 0x18);
            } while ((pointer)(ppAVar10 + 2) !=
                     local_388.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            if ((undefined1  [8])paStack_1c0 != local_1c8) {
              paVar25 = (aiMeshMorphAnim *)operator_new(0x410);
              (paVar25->mName).length = 0;
              (paVar25->mName).data[0] = '\0';
              memset((paVar25->mName).data + 1,0x1b,0x3ff);
              uVar12 = local_218._8_8_;
              paVar25->mNumKeys = 0;
              paVar25->mKeys = (aiMeshMorphKey *)0x0;
              local_390 = paVar25;
              if ((ulong)local_218._8_8_ < (_Base_ptr)0x400) {
                (paVar25->mName).length = (ai_uint32)local_218._8_8_;
                memcpy((paVar25->mName).data,(void *)local_218._0_8_,local_218._8_8_);
                (paVar25->mName).data[uVar12] = '\0';
              }
              local_368 = (undefined1  [8])0x0;
              pMStack_360 = (pointer)0x0;
              local_358[0] = (pointer)0x0;
              uVar36 = 0;
              do {
                cVar41 = SUB81(auVar38,0) + '\b';
                lVar17 = std::__cxx11::string::find(cVar41,0x28);
                lVar48 = std::__cxx11::string::find(cVar41,0x29);
                if ((lVar17 != -1) && (lVar48 != -1)) {
                  lVar17 = *(long *)((((aiAnimation *)auVar38)->mName).data + 0x5c);
                  lVar48 = *(long *)(lVar17 + 8);
                  if (*(long *)(lVar17 + 0x10) != lVar48) {
                    pCVar45 = (pointer)0x1;
                    pCVar39 = (pointer)0x0;
                    do {
                      pCVar35 = pCVar45;
                      lVar17 = *(long *)((((aiAnimation *)auVar38)->mName).data + 0x6c);
                      lVar5 = *(long *)(lVar17 + 8);
                      if ((pointer)(*(long *)(lVar17 + 0x10) - lVar5 >> 2) <= pCVar39) {
                        std::__throw_out_of_range_fmt
                                  (
                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                        goto LAB_003ffc70;
                      }
                      insertMorphTimeValue
                                ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                  *)local_368,*(float *)(lVar48 + (long)pCVar39 * 4),
                                 *(float *)(lVar5 + (long)pCVar39 * 4),uVar36);
                      lVar17 = *(long *)((((aiAnimation *)auVar38)->mName).data + 0x5c);
                      lVar48 = *(long *)(lVar17 + 8);
                      pCVar45 = (pointer)(ulong)((int)pCVar35 + 1);
                      pCVar39 = pCVar35;
                    } while (pCVar35 < (pointer)(*(long *)(lVar17 + 0x10) - lVar48 >> 2));
                  }
                  uVar36 = uVar36 + 1;
                }
                paVar25 = local_390;
                auVar38 = (undefined1  [8])((((aiAnimation *)auVar38)->mName).data + 0x74);
              } while (auVar38 != (undefined1  [8])paStack_1c0);
              uVar47 = (long)pMStack_360 - (long)local_368 >> 5;
              local_390->mNumKeys = (uint)uVar47;
              uVar47 = uVar47 & 0xffffffff;
              puVar26 = (ulong *)operator_new__(uVar47 * 0x20 + 8);
              *puVar26 = uVar47;
              if (uVar47 != 0) {
                lVar17 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar26 + lVar17 + 0x14);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                  puVar3 = (undefined8 *)((long)&((aiMeshMorphKey *)(puVar26 + 1))->mTime + lVar17);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                  lVar17 = lVar17 + 0x20;
                } while (uVar47 * 0x20 != lVar17);
              }
              paVar25->mKeys = (aiMeshMorphKey *)(puVar26 + 1);
              if (paVar25->mNumKeys != 0) {
                uVar36 = 0;
                auVar32 = local_1c8;
                do {
                  uVar21 = (ulong)uVar36;
                  paVar25->mKeys[uVar21].mNumValuesAndWeights =
                       (int)((ulong)((long)auVar38 - (long)auVar32) >> 3) * -0x11111111;
                  lVar17 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  puVar27 = (uint *)operator_new__(-(ulong)((ulong)(lVar17 * -0x1111111111111111) >>
                                                            0x3e != 0) |
                                                   lVar17 * -0x4444444444444444);
                  local_390->mKeys[uVar21].mValues = puVar27;
                  lVar17 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  uVar47 = lVar17 * 0x7777777777777778;
                  if (0x1fffffffffffffff < (ulong)(lVar17 * -0x1111111111111111)) {
                    uVar47 = 0xffffffffffffffff;
                  }
                  pdVar28 = (double *)operator_new__(uVar47);
                  local_390->mKeys[uVar21].mWeights = pdVar28;
                  local_390->mKeys[uVar21].mTime =
                       (double)*(float *)(((aiString *)local_368)->data + uVar21 * 0x20 + -4);
                  auVar32 = (undefined1  [8])paStack_1c0;
                  if ((undefined1  [8])paStack_1c0 != local_1c8) {
                    uVar47 = 0;
                    do {
                      uVar30 = (uint)uVar47;
                      local_390->mKeys[uVar21].mValues[uVar47] = uVar30;
                      lVar17 = *(long *)(((aiString *)local_368)->data +
                                        (long)(int)uVar36 * 0x20 + 4);
                      lVar48 = *(long *)(((aiString *)local_368)->data +
                                        (long)(int)uVar36 * 0x20 + 0xc) - lVar17;
                      dVar7 = 0.0;
                      if (lVar48 != 0) {
                        uVar42 = 1;
                        uVar40 = 0;
                        do {
                          if (*(uint *)(lVar17 + 4 + uVar40 * 8) == uVar30) {
                            dVar7 = (double)*(float *)(lVar17 + uVar40 * 8);
                            break;
                          }
                          uVar40 = (ulong)uVar42;
                          uVar42 = uVar42 + 1;
                          dVar7 = 0.0;
                        } while (uVar40 < (ulong)(lVar48 >> 3));
                      }
                      local_390->mKeys[uVar21].mWeights[uVar47] = dVar7;
                      uVar47 = (ulong)(uVar30 + 1);
                      uVar40 = ((long)paStack_1c0 - (long)local_1c8 >> 3) * -0x1111111111111111;
                      auVar32 = local_1c8;
                    } while (uVar47 <= uVar40 && uVar40 - uVar47 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  paVar25 = local_390;
                  auVar38 = (undefined1  [8])paStack_1c0;
                } while (uVar36 < local_390->mNumKeys);
              }
              if (iStack_310._M_current == (aiMeshMorphAnim **)local_308._M_allocated_capacity) {
                std::vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>>::
                _M_realloc_insert<aiMeshMorphAnim*const&>
                          ((vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>> *)&local_318,
                           iStack_310,&local_390);
              }
              else {
                *iStack_310._M_current = paVar25;
                iStack_310._M_current = iStack_310._M_current + 1;
              }
              std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
              ~vector((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                      local_368);
            }
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)local_1c8);
          }
          if (local_2c8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_2c8);
          }
        }
        if (local_338 != local_328) {
          operator_delete(local_338);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p);
        }
      }
      if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) {
        operator_delete((void *)local_218._0_8_);
      }
      std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
      ~vector(&local_388);
      p_Var46 = (_Base_ptr)&local_1d0->_M_parent;
    } while (p_Var46 !=
             (_Base_ptr)
             local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_2e8 == (aiNodeAnim **)aStack_2e0._M_allocated_capacity) goto LAB_003ff982;
    bVar8 = false;
  }
  uVar12 = aStack_2e0._M_allocated_capacity;
  __src_00 = local_2e8;
  paVar29 = (aiAnimation *)operator_new(0x448);
  (paVar29->mName).length = 0;
  (paVar29->mName).data[0] = '\0';
  memset((paVar29->mName).data + 1,0x1b,0x3ff);
  paVar29->mDuration = -1.0;
  paVar29->mTicksPerSecond = 0.0;
  paVar29->mNumChannels = 0;
  paVar29->mChannels = (aiNodeAnim **)0x0;
  paVar29->mNumMeshChannels = 0;
  paVar29->mMeshChannels = (aiMeshAnim **)0x0;
  paVar29->mNumMorphMeshChannels = 0;
  paVar29->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar47 = local_1d8->_M_string_length;
  local_1c8 = (undefined1  [8])paVar29;
  if (uVar47 < 0x400) {
    (paVar29->mName).length = (ai_uint32)uVar47;
    memcpy((paVar29->mName).data,(local_1d8->_M_dataplus)._M_p,uVar47);
    (paVar29->mName).data[uVar47] = '\0';
  }
  sVar15 = uVar12 - (long)__src_00;
  uVar36 = (uint)((long)sVar15 >> 3);
  paVar29->mNumChannels = uVar36;
  if (uVar36 != 0) {
    uVar47 = 0xffffffffffffffff;
    if ((ulong)((long)sVar15 >> 3) < 0x2000000000000000) {
      uVar47 = sVar15;
    }
    __dest = (aiNodeAnim **)operator_new__(uVar47);
    paVar29->mChannels = __dest;
    if (!bVar8) {
      memmove(__dest,__src_00,sVar15);
    }
  }
  iVar11._M_current = iStack_310._M_current;
  __src._M_p = local_318._M_p;
  uVar47 = (long)iStack_310._M_current - (long)local_318._M_p;
  uVar36 = (uint)(uVar47 >> 3);
  paVar29->mNumMorphMeshChannels = uVar36;
  if (uVar36 != 0) {
    __dest_00 = (aiMeshMorphAnim **)operator_new__(uVar47 & 0x7fffffff8);
    paVar29->mMorphMeshChannels = __dest_00;
    if (iVar11._M_current != (aiMeshMorphAnim **)__src._M_p) {
      memmove(__dest_00,__src._M_p,uVar47);
    }
  }
  paVar29->mDuration = 0.0;
  if (aStack_2e0._M_allocated_capacity - (long)__src_00 == 0) {
    uVar55 = 0;
    uVar56 = 0;
  }
  else {
    lVar17 = (long)(aStack_2e0._M_allocated_capacity - (long)__src_00) >> 3;
    uVar55 = 0;
    uVar56 = 0;
    lVar48 = 0;
    do {
      dVar7 = __src_00[lVar48]->mPositionKeys[__src_00[lVar48]->mNumPositionKeys - 1].mTime;
      uVar57 = SUB84(dVar7,0);
      uVar58 = (int)((ulong)dVar7 >> 0x20);
      if (dVar7 <= (double)CONCAT44(uVar56,uVar55)) {
        uVar57 = uVar55;
        uVar58 = uVar56;
      }
      paVar29->mDuration = (double)CONCAT44(uVar58,uVar57);
      dVar7 = __src_00[lVar48]->mRotationKeys[__src_00[lVar48]->mNumRotationKeys - 1].mTime;
      uVar59 = SUB84(dVar7,0);
      uVar60 = (int)((ulong)dVar7 >> 0x20);
      if (dVar7 <= (double)CONCAT44(uVar58,uVar57)) {
        uVar59 = uVar57;
        uVar60 = uVar58;
      }
      paVar29->mDuration = (double)CONCAT44(uVar60,uVar59);
      dVar7 = __src_00[lVar48]->mScalingKeys[__src_00[lVar48]->mNumScalingKeys - 1].mTime;
      uVar55 = SUB84(dVar7,0);
      uVar56 = (int)((ulong)dVar7 >> 0x20);
      if (dVar7 <= (double)CONCAT44(uVar60,uVar59)) {
        uVar55 = uVar59;
        uVar56 = uVar60;
      }
      paVar29->mDuration = (double)CONCAT44(uVar56,uVar55);
      lVar48 = lVar48 + 1;
    } while (lVar17 + (ulong)(lVar17 == 0) != lVar48);
  }
  if (iVar11._M_current != (aiMeshMorphAnim **)__src._M_p) {
    lVar17 = 0;
    do {
      dVar7 = *(double *)
               (*(long *)(*(long *)(__src._M_p + lVar17 * 8) + 0x408) +
               (ulong)(*(int *)(*(long *)(__src._M_p + lVar17 * 8) + 0x404) - 1) * 0x20);
      uVar57 = SUB84(dVar7,0);
      uVar58 = (int)((ulong)dVar7 >> 0x20);
      if (dVar7 <= (double)CONCAT44(uVar56,uVar55)) {
        uVar57 = uVar55;
        uVar58 = uVar56;
      }
      uVar56 = uVar58;
      uVar55 = uVar57;
      paVar29->mDuration = (double)CONCAT44(uVar56,uVar55);
      lVar17 = lVar17 + 1;
    } while (((long)uVar47 >> 3) + (ulong)((long)uVar47 >> 3 == 0) != lVar17);
  }
  paVar29->mTicksPerSecond = 1.0;
  __position._M_current =
       (local_230->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_230->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiAnimation*,std::allocator<aiAnimation*>>::_M_realloc_insert<aiAnimation*const&>
              ((vector<aiAnimation*,std::allocator<aiAnimation*>> *)&local_230->mAnims,__position,
               (aiAnimation **)local_1c8);
  }
  else {
    *__position._M_current = paVar29;
    pppaVar1 = &(local_230->mAnims).
                super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
LAB_003ffc22:
  if ((aiMeshMorphAnim **)local_318._M_p != (aiMeshMorphAnim **)0x0) {
    operator_delete(local_318._M_p);
  }
  if (local_2e8 != (aiNodeAnim **)0x0) {
    operator_delete(local_2e8);
  }
  if ((_Base_ptr)
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}